

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void tinyexr::sendCode(longlong sCode,int runCount,longlong runCode,longlong *c,int *lc,char **out)

{
  longlong lVar1;
  longlong lVar2;
  longlong lVar3;
  char **out_local;
  int *lc_local;
  longlong *c_local;
  longlong runCode_local;
  int runCount_local;
  longlong sCode_local;
  
  lVar1 = hufLength(sCode);
  lVar2 = hufLength(runCode);
  lVar3 = hufLength(sCode);
  runCode_local._4_4_ = runCount;
  if (lVar1 + lVar2 + 8 < lVar3 * runCount) {
    outputCode(sCode,c,lc,out);
    outputCode(runCode,c,lc,out);
    outputBits(8,(long)runCount,c,lc,out);
  }
  else {
    while (-1 < runCode_local._4_4_) {
      outputCode(sCode,c,lc,out);
      runCode_local._4_4_ = runCode_local._4_4_ + -1;
    }
  }
  return;
}

Assistant:

inline void sendCode(long long sCode, int runCount, long long runCode,
                     long long &c, int &lc, char *&out) {
  //
  // Output a run of runCount instances of the symbol sCount.
  // Output the symbols explicitly, or if that is shorter, output
  // the sCode symbol once followed by a runCode symbol and runCount
  // expressed as an 8-bit number.
  //

  if (hufLength(sCode) + hufLength(runCode) + 8 < hufLength(sCode) * runCount) {
    outputCode(sCode, c, lc, out);
    outputCode(runCode, c, lc, out);
    outputBits(8, runCount, c, lc, out);
  } else {
    while (runCount-- >= 0) outputCode(sCode, c, lc, out);
  }
}